

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  if (argc < 2) {
    printf("Usage : %s [options] XMLfiles ...\n",*argv);
    puts("\tParse the XML files using the xmlTextReader API");
    puts("\t --count: count the number of attribute and elements");
    puts("\t --valid: validate the document");
    puts("\t --consumed: count the number of bytes consumed");
    exit(1);
  }
  xmlCheckVersion(0x33072);
  local_44 = noent;
  local_40 = valid;
  local_3c = consumed;
  local_38 = count;
  uVar8 = 1;
  iVar3 = dump;
  iVar6 = debug;
  do {
    pcVar1 = argv[uVar8];
    iVar2 = strcmp(pcVar1,"-debug");
    if (iVar2 == 0) {
LAB_001013b4:
      iVar6 = iVar6 + 1;
      debug = iVar6;
    }
    else {
      iVar2 = strcmp(pcVar1,"--debug");
      if (iVar2 == 0) goto LAB_001013b4;
      iVar2 = strcmp(pcVar1,"-dump");
      if (iVar2 == 0) {
LAB_001013be:
        iVar3 = iVar3 + 1;
        dump = iVar3;
      }
      else {
        iVar2 = strcmp(pcVar1,"--dump");
        if (iVar2 == 0) goto LAB_001013be;
        iVar2 = strcmp(pcVar1,"-count");
        if (iVar2 == 0) {
LAB_001013ca:
          count = local_38 + 1;
          local_38 = count;
        }
        else {
          iVar2 = strcmp(pcVar1,"--count");
          if (iVar2 == 0) goto LAB_001013ca;
          iVar2 = strcmp(pcVar1,"-consumed");
          if (iVar2 == 0) {
LAB_001013dc:
            consumed = local_3c + 1;
            local_3c = consumed;
          }
          else {
            iVar2 = strcmp(pcVar1,"--consumed");
            if (iVar2 == 0) goto LAB_001013dc;
            iVar2 = strcmp(pcVar1,"-valid");
            if (iVar2 == 0) {
LAB_001013ee:
              valid = local_40 + 1;
              local_40 = valid;
            }
            else {
              iVar2 = strcmp(pcVar1,"--valid");
              if (iVar2 == 0) goto LAB_001013ee;
              iVar2 = strcmp(pcVar1,"-noent");
              if (iVar2 == 0) {
LAB_001013a2:
                noent = local_44 + 1;
                local_44 = noent;
              }
              else {
                iVar2 = strcmp(pcVar1,"--noent");
                if (iVar2 == 0) goto LAB_001013a2;
              }
            }
          }
        }
      }
    }
    uVar8 = uVar8 + 1;
    if ((uint)argc == uVar8) {
      if (noent != 0) {
        xmlSubstituteEntitiesDefault(1);
      }
      uVar8 = 2;
      if (2 < argc) {
        uVar8 = (ulong)(uint)argc;
      }
      uVar7 = 1;
      do {
        pcVar1 = argv[uVar7];
        if (*pcVar1 != '-') {
          if (count != 0) {
            elem = 0;
            attrs = 0;
          }
          lVar4 = xmlNewTextReaderFilename(pcVar1);
          if (lVar4 == 0) {
            fprintf(_stderr,"Unable to open %s\n",pcVar1);
          }
          else {
            if (valid != 0) {
              xmlTextReaderSetParserProp(lVar4,3,1);
            }
            while( true ) {
              iVar3 = xmlTextReaderRead(lVar4);
              if (iVar3 != 1) break;
              iVar3 = xmlTextReaderNodeType(lVar4);
              if ((count != 0) && (iVar3 == 1)) {
                elem = elem + 1;
                iVar3 = xmlTextReaderAttributeCount(lVar4);
                attrs = attrs + iVar3;
              }
            }
            if (consumed != 0) {
              uVar5 = xmlTextReaderByteConsumed(lVar4);
              printf("%ld bytes consumed by parser\n",uVar5);
            }
            xmlFreeTextReader(lVar4);
            if (iVar3 == 0) {
              if (count != 0) {
                printf("%s : %d elements, %d attributes\n",pcVar1,(ulong)(uint)elem,
                       (ulong)(uint)attrs);
              }
            }
            else {
              printf("%s : failed to parse\n",pcVar1);
            }
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar8);
      xmlCleanupParser();
      xmlMemoryDump();
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int files = 0;

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }
    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else if ((!strcmp(argv[i], "-dump")) || (!strcmp(argv[i], "--dump")))
	    dump++;
	else if ((!strcmp(argv[i], "-count")) || (!strcmp(argv[i], "--count")))
	    count++;
	else if ((!strcmp(argv[i], "-consumed")) || (!strcmp(argv[i], "--consumed")))
	    consumed++;
	else if ((!strcmp(argv[i], "-valid")) || (!strcmp(argv[i], "--valid")))
	    valid++;
	else if ((!strcmp(argv[i], "-noent")) ||
	         (!strcmp(argv[i], "--noent")))
	    noent++;
    }
    if (noent != 0) xmlSubstituteEntitiesDefault(1);
    for (i = 1; i < argc ; i++) {
	if (argv[i][0] != '-') {
	    handleFile(argv[i]);
	    files ++;
	}
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}